

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t FSE_decompress_wksp_bmi2
                 (void *dst,size_t dstCapacity,void *cSrc,size_t cSrcSize,uint maxLog,
                 void *workSpace,size_t wkspSize,int bmi2)

{
  FSE_DTable *dt;
  ulong *srcBuffer;
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  uint uVar8;
  undefined1 *puVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  undefined1 *puVar14;
  undefined1 *puVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  uint tableLog;
  BIT_DStream_t bitD;
  FSE_DState_t state1;
  int local_c0;
  uint local_9c [6];
  uint local_84;
  undefined1 *local_80;
  BIT_DStream_t local_78;
  FSE_DState_t local_50;
  FSE_DState_t local_40;
  
  if (bmi2 != 0) {
    sVar5 = FSE_decompress_wksp_body_bmi2(dst,dstCapacity,cSrc,cSrcSize,maxLog,workSpace,wkspSize);
    return sVar5;
  }
  local_9c[0] = 0xff;
  sVar5 = 0xffffffffffffffff;
  if ((((0x203 < wkspSize) &&
       (sVar6 = FSE_readNCount_bmi2((short *)workSpace,local_9c,&local_84,cSrc,cSrcSize,0),
       sVar5 = sVar6, sVar6 < 0xffffffffffffff89)) &&
      (sVar5 = 0xffffffffffffffd4, local_84 <= maxLog)) &&
     (lVar13 = (long)(1 << ((byte)local_84 & 0x1f)),
     ((1L << ((byte)local_84 & 0x3f)) + lVar13 * 4 + (ulong)(local_9c[0] + 1) * 2 + 0x13 &
     0xfffffffffffffffc) + 0x204 <= wkspSize)) {
    dt = (FSE_DTable *)((long)workSpace + 0x200);
    sVar5 = FSE_buildDTable_internal
                      (dt,(short *)workSpace,local_9c[0],local_84,
                       (void *)(lVar13 * 4 + 0x208 + (long)workSpace),
                       (wkspSize - (lVar13 * 4 + 4)) - 0x204);
    if (sVar5 < 0xffffffffffffff89) {
      srcBuffer = (ulong *)((long)cSrc + sVar6);
      sVar6 = cSrcSize - sVar6;
      local_80 = (undefined1 *)((long)dst + (dstCapacity - 3));
      if (*(short *)((long)workSpace + 0x202) == 0) {
        sVar5 = BIT_initDStream(&local_78,srcBuffer,sVar6);
        if (sVar5 < 0xffffffffffffff89) {
          FSE_initDState(&local_40,&local_78,dt);
          FSE_initDState(&local_50,&local_78,dt);
          local_c0 = (int)local_78.start;
          puVar15 = (undefined1 *)dst;
          puVar9 = (undefined1 *)dst;
          if (local_78.bitsConsumed < 0x41) {
            do {
              puVar15 = puVar9;
              if (local_78.ptr < local_78.limitPtr) {
                if (local_78.ptr == local_78.start) break;
                bVar20 = local_78.start <=
                         (ulong *)((long)local_78.ptr - (ulong)(local_78.bitsConsumed >> 3));
                uVar8 = (int)local_78.ptr - local_c0;
                if (bVar20) {
                  uVar8 = local_78.bitsConsumed >> 3;
                }
                local_78.bitsConsumed = local_78.bitsConsumed + uVar8 * -8;
              }
              else {
                uVar8 = local_78.bitsConsumed >> 3;
                local_78.bitsConsumed = local_78.bitsConsumed & 7;
                bVar20 = true;
              }
              local_78.ptr = (char *)((long)local_78.ptr - (ulong)uVar8);
              local_78.bitContainer = *(size_t *)local_78.ptr;
              if ((local_80 <= puVar9) || (!bVar20)) break;
              bVar1 = *(byte *)((long)local_40.table + local_40.state * 4 + 3);
              iVar16 = local_78.bitsConsumed + bVar1;
              uVar18 = (ulong)*(ushort *)((long)local_40.table + local_40.state * 4);
              uVar19 = (-1L << (bVar1 & 0x3f) ^ 0xffffffffffffffffU) &
                       local_78.bitContainer >> (-(char)iVar16 & 0x3fU);
              *puVar9 = *(undefined1 *)((long)local_40.table + local_40.state * 4 + 2);
              uVar12 = (ulong)*(ushort *)((long)local_50.table + local_50.state * 4);
              bVar1 = *(byte *)((long)local_50.table + local_50.state * 4 + 3);
              iVar16 = iVar16 + (uint)bVar1;
              uVar17 = (-1L << (bVar1 & 0x3f) ^ 0xffffffffffffffffU) &
                       local_78.bitContainer >> (-(char)iVar16 & 0x3fU);
              puVar9[1] = *(undefined1 *)((long)local_50.table + local_50.state * 4 + 2);
              bVar1 = *(byte *)((long)local_40.table + uVar18 * 4 + uVar19 * 4 + 3);
              iVar16 = iVar16 + (uint)bVar1;
              local_40.state =
                   (~(-1L << (bVar1 & 0x3f)) & local_78.bitContainer >> (-(char)iVar16 & 0x3fU)) +
                   (ulong)*(ushort *)((long)local_40.table + uVar18 * 4 + uVar19 * 4);
              puVar9[2] = *(undefined1 *)((long)local_40.table + uVar18 * 4 + uVar19 * 4 + 2);
              bVar1 = *(byte *)((long)local_50.table + uVar12 * 4 + uVar17 * 4 + 3);
              local_78.bitsConsumed = iVar16 + (uint)bVar1;
              local_50.state =
                   (~(-1L << (bVar1 & 0x3f)) &
                   local_78.bitContainer >> (-(char)local_78.bitsConsumed & 0x3fU)) +
                   (ulong)*(ushort *)((long)local_50.table + uVar12 * 4 + uVar17 * 4);
              puVar9[3] = *(undefined1 *)((long)local_50.table + uVar12 * 4 + uVar17 * 4 + 2);
              puVar15 = puVar9 + 4;
              puVar9 = puVar9 + 4;
              if (0x40 < local_78.bitsConsumed) break;
            } while( true );
          }
          puVar9 = (undefined1 *)((long)dst + (dstCapacity - 2));
          sVar5 = 0xffffffffffffffba;
          if (puVar15 <= puVar9) {
            lVar13 = (long)puVar15 - (long)dst;
            puVar15 = puVar15 + 1;
            do {
              uVar3 = *(ushort *)((long)local_40.table + local_40.state * 4);
              bVar1 = *(byte *)((long)local_40.table + local_40.state * 4 + 3);
              local_78.bitsConsumed = local_78.bitsConsumed + bVar1;
              uVar18 = local_78.bitContainer >> (-(char)local_78.bitsConsumed & 0x3fU);
              puVar15[-1] = *(undefined1 *)((long)local_40.table + local_40.state * 4 + 2);
              if (0x40 < local_78.bitsConsumed) {
                local_40.table = (void *)((long)local_50.table + local_50.state * 4);
                goto LAB_001557ee;
              }
              if (local_78.ptr < local_78.limitPtr) {
                if (local_78.ptr != local_78.start) {
                  uVar8 = (int)local_78.ptr - local_c0;
                  if (local_78.start <=
                      (ulong *)((long)local_78.ptr - (ulong)(local_78.bitsConsumed >> 3))) {
                    uVar8 = local_78.bitsConsumed >> 3;
                  }
                  local_78.bitsConsumed = local_78.bitsConsumed + uVar8 * -8;
                  goto LAB_0015547c;
                }
              }
              else {
                uVar8 = local_78.bitsConsumed >> 3;
                local_78.bitsConsumed = local_78.bitsConsumed & 7;
LAB_0015547c:
                local_78.ptr = (char *)((long)local_78.ptr - (ulong)uVar8);
                local_78.bitContainer = *(size_t *)local_78.ptr;
              }
              if (puVar9 < puVar15) {
                return 0xffffffffffffffba;
              }
              uVar4 = *(ushort *)((long)local_50.table + local_50.state * 4);
              bVar2 = *(byte *)((long)local_50.table + local_50.state * 4 + 3);
              local_78.bitsConsumed = local_78.bitsConsumed + bVar2;
              uVar12 = local_78.bitContainer >> (-(char)local_78.bitsConsumed & 0x3fU);
              local_40.state = (uVar18 & ~(-1L << (bVar1 & 0x3f))) + (ulong)uVar3;
              *puVar15 = *(undefined1 *)((long)local_50.table + local_50.state * 4 + 2);
              if (0x40 < local_78.bitsConsumed) {
                local_40.table = (void *)((long)local_40.table + local_40.state * 4);
                goto LAB_001557fd;
              }
              if (local_78.ptr < local_78.limitPtr) {
                if (local_78.ptr != local_78.start) {
                  uVar8 = (int)local_78.ptr - local_c0;
                  if (local_78.start <=
                      (ulong *)((long)local_78.ptr - (ulong)(local_78.bitsConsumed >> 3))) {
                    uVar8 = local_78.bitsConsumed >> 3;
                  }
                  local_78.bitsConsumed = local_78.bitsConsumed + uVar8 * -8;
                  goto LAB_00155517;
                }
              }
              else {
                uVar8 = local_78.bitsConsumed >> 3;
                local_78.bitsConsumed = local_78.bitsConsumed & 7;
LAB_00155517:
                local_78.ptr = (char *)((long)local_78.ptr - (ulong)uVar8);
                local_78.bitContainer = *(size_t *)local_78.ptr;
              }
              local_50.state = (uVar12 & ~(-1L << (bVar2 & 0x3f))) + (ulong)uVar4;
              lVar13 = lVar13 + 2;
              puVar14 = puVar15 + 1;
              puVar15 = puVar15 + 2;
            } while (puVar14 <= puVar9);
          }
        }
      }
      else if (sVar6 == 0) {
        sVar5 = 0xffffffffffffffb8;
      }
      else {
        local_78.limitPtr = (char *)(srcBuffer + 1);
        if (sVar6 < 8) {
          local_78.bitContainer = (size_t)(byte)*srcBuffer;
          switch(sVar6) {
          case 7:
            local_78.bitContainer =
                 local_78.bitContainer | (ulong)*(byte *)((long)srcBuffer + 6) << 0x30;
          case 6:
            local_78.bitContainer =
                 local_78.bitContainer + ((ulong)*(byte *)((long)srcBuffer + 5) << 0x28);
          case 5:
            local_78.bitContainer =
                 local_78.bitContainer + ((ulong)*(byte *)((long)srcBuffer + 4) << 0x20);
          case 4:
            local_78.bitContainer =
                 local_78.bitContainer + (ulong)*(byte *)((long)srcBuffer + 3) * 0x1000000;
          case 3:
            local_78.bitContainer =
                 local_78.bitContainer + (ulong)*(byte *)((long)srcBuffer + 2) * 0x10000;
          case 2:
            local_78.bitContainer =
                 (ulong)*(byte *)((long)srcBuffer + 1) * 0x100 + local_78.bitContainer;
          }
          bVar1 = *(byte *)((long)cSrc + (cSrcSize - 1));
          if (bVar1 == 0) {
            return 0xffffffffffffffec;
          }
          uVar8 = 0x1f;
          if (bVar1 != 0) {
            for (; bVar1 >> uVar8 == 0; uVar8 = uVar8 - 1) {
            }
          }
          local_78.bitsConsumed = (uVar8 ^ 0x1f) + (int)sVar6 * -8 + 0x29;
          local_78.ptr = (char *)srcBuffer;
        }
        else {
          local_78.ptr = (char *)((long)cSrc + (cSrcSize - 8));
          local_78.bitContainer = *(size_t *)local_78.ptr;
          if (local_78.bitContainer >> 0x38 == 0) {
            return 0xffffffffffffffff;
          }
          uVar8 = 0x1f;
          bVar1 = (byte)(local_78.bitContainer >> 0x38);
          if (bVar1 != 0) {
            for (; bVar1 >> uVar8 == 0; uVar8 = uVar8 - 1) {
            }
          }
          local_78.bitsConsumed = ~uVar8 + 9;
          if (0xffffffffffffff88 < sVar6) {
            return sVar6;
          }
        }
        local_78.start = (char *)srcBuffer;
        FSE_initDState(&local_40,&local_78,dt);
        FSE_initDState(&local_50,&local_78,dt);
        iVar16 = (int)local_78.start;
        puVar15 = (undefined1 *)dst;
        puVar9 = (undefined1 *)dst;
        if (local_78.bitsConsumed < 0x41) {
          do {
            puVar15 = puVar9;
            if (local_78.ptr < local_78.limitPtr) {
              if (local_78.ptr == local_78.start) break;
              bVar20 = local_78.start <=
                       (ulong *)((long)local_78.ptr - (ulong)(local_78.bitsConsumed >> 3));
              uVar8 = (int)local_78.ptr - iVar16;
              if (bVar20) {
                uVar8 = local_78.bitsConsumed >> 3;
              }
              local_78.bitsConsumed = local_78.bitsConsumed + uVar8 * -8;
            }
            else {
              uVar8 = local_78.bitsConsumed >> 3;
              local_78.bitsConsumed = local_78.bitsConsumed & 7;
              bVar20 = true;
            }
            local_78.ptr = (char *)((long)local_78.ptr - (ulong)uVar8);
            local_78.bitContainer = *(size_t *)local_78.ptr;
            if ((local_80 <= puVar9) || (!bVar20)) break;
            uVar18 = (ulong)*(ushort *)((long)local_40.table + local_40.state * 4);
            bVar1 = *(byte *)((long)local_40.table + local_40.state * 4 + 3);
            iVar10 = local_78.bitsConsumed + bVar1;
            uVar12 = (local_78.bitContainer << ((byte)local_78.bitsConsumed & 0x3f)) >>
                     (-bVar1 & 0x3f);
            *puVar9 = *(undefined1 *)((long)local_40.table + local_40.state * 4 + 2);
            uVar17 = (ulong)*(ushort *)((long)local_50.table + local_50.state * 4);
            bVar1 = *(byte *)((long)local_50.table + local_50.state * 4 + 3);
            iVar11 = iVar10 + (uint)bVar1;
            uVar19 = (local_78.bitContainer << ((byte)iVar10 & 0x3f)) >> (-bVar1 & 0x3f);
            puVar9[1] = *(undefined1 *)((long)local_50.table + local_50.state * 4 + 2);
            bVar1 = *(byte *)((long)local_40.table + uVar18 * 4 + uVar12 * 4 + 3);
            iVar10 = iVar11 + (uint)bVar1;
            local_40.state =
                 ((local_78.bitContainer << ((byte)iVar11 & 0x3f)) >> (-bVar1 & 0x3f)) +
                 (ulong)*(ushort *)((long)local_40.table + uVar18 * 4 + uVar12 * 4);
            puVar9[2] = *(undefined1 *)((long)local_40.table + uVar18 * 4 + uVar12 * 4 + 2);
            bVar1 = *(byte *)((long)local_50.table + uVar17 * 4 + uVar19 * 4 + 3);
            local_78.bitsConsumed = iVar10 + (uint)bVar1;
            local_50.state =
                 ((local_78.bitContainer << ((byte)iVar10 & 0x3f)) >> (-bVar1 & 0x3f)) +
                 (ulong)*(ushort *)((long)local_50.table + uVar17 * 4 + uVar19 * 4);
            puVar9[3] = *(undefined1 *)((long)local_50.table + uVar17 * 4 + uVar19 * 4 + 2);
            puVar15 = puVar9 + 4;
            puVar9 = puVar9 + 4;
            if (0x40 < local_78.bitsConsumed) break;
          } while( true );
        }
        puVar9 = (undefined1 *)((long)dst + (dstCapacity - 2));
        sVar5 = 0xffffffffffffffba;
        if (puVar15 <= puVar9) {
          lVar13 = (long)puVar15 - (long)dst;
          puVar15 = puVar15 + 1;
          do {
            uVar3 = *(ushort *)((long)local_40.table + local_40.state * 4);
            bVar1 = *(byte *)((long)local_40.table + local_40.state * 4 + 3);
            uVar18 = local_78.bitContainer << ((byte)local_78.bitsConsumed & 0x3f);
            local_78.bitsConsumed = local_78.bitsConsumed + bVar1;
            puVar15[-1] = *(undefined1 *)((long)local_40.table + local_40.state * 4 + 2);
            if (0x40 < local_78.bitsConsumed) {
              local_40.table = (void *)((long)local_50.table + local_50.state * 4);
LAB_001557ee:
              lVar7 = 2;
              goto LAB_00155805;
            }
            if (local_78.ptr < local_78.limitPtr) {
              if (local_78.ptr != local_78.start) {
                uVar8 = (int)local_78.ptr - iVar16;
                if (local_78.start <=
                    (ulong *)((long)local_78.ptr - (ulong)(local_78.bitsConsumed >> 3))) {
                  uVar8 = local_78.bitsConsumed >> 3;
                }
                local_78.bitsConsumed = local_78.bitsConsumed + uVar8 * -8;
                goto LAB_001556f9;
              }
            }
            else {
              uVar8 = local_78.bitsConsumed >> 3;
              local_78.bitsConsumed = local_78.bitsConsumed & 7;
LAB_001556f9:
              local_78.ptr = (char *)((long)local_78.ptr - (ulong)uVar8);
              local_78.bitContainer = *(size_t *)local_78.ptr;
            }
            if (puVar9 < puVar15) {
              return 0xffffffffffffffba;
            }
            uVar4 = *(ushort *)((long)local_50.table + local_50.state * 4);
            bVar2 = *(byte *)((long)local_50.table + local_50.state * 4 + 3);
            uVar12 = local_78.bitContainer << ((byte)local_78.bitsConsumed & 0x3f);
            local_78.bitsConsumed = local_78.bitsConsumed + bVar2;
            local_40.state = (uVar18 >> (-bVar1 & 0x3f)) + (ulong)uVar3;
            *puVar15 = *(undefined1 *)((long)local_50.table + local_50.state * 4 + 2);
            if (0x40 < local_78.bitsConsumed) {
              local_40.table = (void *)((long)local_40.table + local_40.state * 4);
LAB_001557fd:
              puVar15 = puVar15 + 1;
              lVar7 = 3;
LAB_00155805:
              *puVar15 = *(undefined1 *)((long)local_40.table + 2);
              return lVar7 + lVar13;
            }
            if (local_78.ptr < local_78.limitPtr) {
              if (local_78.ptr != local_78.start) {
                uVar8 = (int)local_78.ptr - iVar16;
                if (local_78.start <=
                    (ulong *)((long)local_78.ptr - (ulong)(local_78.bitsConsumed >> 3))) {
                  uVar8 = local_78.bitsConsumed >> 3;
                }
                local_78.bitsConsumed = local_78.bitsConsumed + uVar8 * -8;
                goto LAB_00155789;
              }
            }
            else {
              uVar8 = local_78.bitsConsumed >> 3;
              local_78.bitsConsumed = local_78.bitsConsumed & 7;
LAB_00155789:
              local_78.ptr = (char *)((long)local_78.ptr - (ulong)uVar8);
              local_78.bitContainer = *(size_t *)local_78.ptr;
            }
            local_50.state = (uVar12 >> (-bVar2 & 0x3f)) + (ulong)uVar4;
            lVar13 = lVar13 + 2;
            puVar14 = puVar15 + 1;
            puVar15 = puVar15 + 2;
          } while (puVar14 <= puVar9);
        }
      }
    }
  }
  return sVar5;
}

Assistant:

size_t FSE_decompress_wksp_bmi2(void* dst, size_t dstCapacity, const void* cSrc, size_t cSrcSize, unsigned maxLog, void* workSpace, size_t wkspSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        return FSE_decompress_wksp_body_bmi2(dst, dstCapacity, cSrc, cSrcSize, maxLog, workSpace, wkspSize);
    }
#endif
    (void)bmi2;
    return FSE_decompress_wksp_body_default(dst, dstCapacity, cSrc, cSrcSize, maxLog, workSpace, wkspSize);
}